

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id,bool tab_stop)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  byte in_DL;
  ImGuiID in_ESI;
  long in_RDI;
  bool bVar3;
  bool is_tab_stop;
  ImGuiContext *g;
  bool in_stack_ffffffffffffffd3;
  ImGuiKey in_stack_ffffffffffffffd4;
  int iVar4;
  bool local_1;
  
  pIVar1 = GImGui;
  bVar3 = (*(uint *)(in_RDI + 0x178) & 5) == 0;
  *(int *)(in_RDI + 0x3a8) = *(int *)(in_RDI + 0x3a8) + 1;
  if (bVar3) {
    *(int *)(in_RDI + 0x3ac) = *(int *)(in_RDI + 0x3ac) + 1;
  }
  if ((((((in_DL & 1) != 0) && (pIVar1->ActiveId == in_ESI)) &&
       (*(int *)(in_RDI + 0x3b8) == 0x7fffffff)) &&
      ((*(int *)(in_RDI + 0x3bc) == 0x7fffffff && (((pIVar1->IO).KeyCtrl & 1U) == 0)))) &&
     (bVar2 = IsKeyPressedMap(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd3), bVar2)) {
    if (((pIVar1->IO).KeyShift & 1U) == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
      if (bVar3) {
        iVar4 = -1;
      }
    }
    *(int *)(in_RDI + 0x3bc) = *(int *)(in_RDI + 0x3ac) + iVar4;
  }
  if (*(int *)(in_RDI + 0x3a8) == *(int *)(in_RDI + 0x3b0)) {
    local_1 = true;
  }
  else if ((bVar3) && (*(int *)(in_RDI + 0x3ac) == *(int *)(in_RDI + 0x3b4))) {
    pIVar1->NavJustTabbedId = in_ESI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->FocusIdxAllCounter++;
    if (is_tab_stop)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB/Shift-TAB to tab out of the currently focused item.
    // Note that we can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && (g.ActiveId == id) && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab))
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;
    if (is_tab_stop && window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
    {
        g.NavJustTabbedId = id;
        return true;
    }

    return false;
}